

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

TValue * luaV_tonumber(TValue *obj,TValue *n)

{
  int iVar1;
  TValue *io;
  lua_Number num;
  TValue *n_local;
  TValue *obj_local;
  
  obj_local = obj;
  if (obj->tt_ != 3) {
    if (((obj->tt_ & 0xfU) == 4) &&
       (num = (lua_Number)n, n_local = obj,
       iVar1 = luaO_str2d((char *)((obj->value_).f + 0x18),*(size_t *)((obj->value_).f + 0x10),
                          (lua_Number *)&io), iVar1 != 0)) {
      *(TValue **)num = io;
      *(undefined4 *)((long)num + 8) = 3;
      obj_local = (TValue *)num;
    }
    else {
      obj_local = (TValue *)0x0;
    }
  }
  return obj_local;
}

Assistant:

const TValue *luaV_tonumber (const TValue *obj, TValue *n) {
  lua_Number num;
  if (ttisnumber(obj)) return obj;
  if (ttisstring(obj) && luaO_str2d(svalue(obj), tsvalue(obj)->len, &num)) {
    setnvalue(n, num);
    return n;
  }
  else
    return NULL;
}